

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,Context *context,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances)

{
  UniformBlock *pUVar1;
  Uniform local_68;
  
  deqp::gls::UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,context->m_testCtx,context->m_renderCtx,name,description,
             GLSL_VERSION_300_ES,BUFFERMODE_PER_BLOCK);
  (this->super_UniformBlockCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00d26598;
  pUVar1 = deqp::gls::ub::ShaderInterface::allocBlock
                     (&(this->super_UniformBlockCase).m_interface,"Block");
  deqp::gls::ub::Uniform::Uniform(&local_68,"var",type,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (&pUVar1->m_uniforms,&local_68);
  deqp::gls::ub::VarType::~VarType(&local_68.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
    operator_delete(local_68.m_name._M_dataplus._M_p,
                    local_68.m_name.field_2._M_allocated_capacity + 1);
  }
  pUVar1->m_flags = layoutFlags;
  if (0 < numInstances) {
    pUVar1->m_arraySize = numInstances;
    std::__cxx11::string::_M_replace
              ((ulong)&pUVar1->m_instanceName,0,(char *)(pUVar1->m_instanceName)._M_string_length,
               0xb1839d);
  }
  return;
}

Assistant:

BlockBasicTypeCase (Context& context, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances)
		: UniformBlockCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_300_ES, BUFFERMODE_PER_BLOCK)
	{
		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("var", type, 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}
	}